

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestChildExtensionData::~TestChildExtensionData(TestChildExtensionData *this)

{
  TestChildExtensionData *this_local;
  
  ~TestChildExtensionData(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestChildExtensionData::~TestChildExtensionData() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestChildExtensionData)
  SharedDtor(*this);
}